

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WienerFilter.cpp
# Opt level: O0

double WienerFilterImpl(Mat *src,Mat *dst,double noiseVariance,Size *block)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  Size *pSVar4;
  uchar uVar5;
  int iVar6;
  double *pdVar7;
  double local_7f0;
  double local_7e8;
  int local_7dc;
  double *pdStack_7d8;
  int c;
  double *meanRow;
  double *varRow;
  uchar *dstRow;
  uchar *srcRow;
  undefined1 local_7b0 [4];
  int r;
  _InputArray local_798;
  _OutputArray local_780;
  _InputArray local_768;
  _InputArray local_750;
  _InputArray local_738 [14];
  Mat local_5d8 [352];
  _InputArray local_478;
  _InputArray local_460 [14];
  undefined1 local_300 [8];
  Mat1d means2;
  Size_<int> local_298;
  _OutputArray local_290;
  _InputArray local_278;
  Point_<int> local_260;
  Size_<int> local_258;
  _OutputArray local_250;
  _InputArray local_238;
  undefined1 local_220 [8];
  Mat1d avgVarianceMat;
  Mat1d variances;
  Mat1d sqrMeans;
  Mat1d means;
  Mat_<unsigned_char> local_90;
  int local_30;
  int local_2c;
  int w;
  int h;
  Size *block_local;
  double noiseVariance_local;
  Mat *dst_local;
  Mat *src_local;
  
  bVar3 = false;
  if (((block->width % 2 == 1) && (bVar3 = false, block->height % 2 == 1)) &&
     (bVar3 = false, 1 < block->width)) {
    bVar3 = 1 < block->height;
  }
  _w = block;
  block_local = (Size *)noiseVariance;
  noiseVariance_local = (double)dst;
  dst_local = src;
  if (!bVar3) {
    __assert_fail("(\"Invalid block dimensions\", block.width % 2 == 1 && block.height % 2 == 1 && block.width > 1 && block.height > 1)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/prittt[P]AdaptiveWienerFilter/WienerFilter.cpp"
                  ,0x27,"double WienerFilterImpl(const Mat &, Mat &, double, const Size &)");
  }
  cv::Mat::channels(src);
  iVar6 = cv::Mat::channels((Mat *)noiseVariance_local);
  if (iVar6 == 1) {
    local_2c = *(int *)(dst_local + 8);
    local_30 = *(int *)(dst_local + 0xc);
    cv::Mat_<unsigned_char>::Mat_((Mat_<unsigned_char> *)&local_90.super_Mat,local_2c,local_30);
    cv::Mat::operator=((Mat *)noiseVariance_local,&local_90.super_Mat);
    cv::Mat_<unsigned_char>::~Mat_(&local_90);
    cv::Mat_<double>::Mat_((Mat_<double> *)&sqrMeans.field_0x58);
    cv::Mat_<double>::Mat_((Mat_<double> *)&variances.field_0x58);
    cv::Mat_<double>::Mat_((Mat_<double> *)&avgVarianceMat.field_0x58);
    cv::Mat_<double>::Mat_((Mat_<double> *)local_220);
    cv::_InputArray::_InputArray(&local_238,dst_local);
    cv::_OutputArray::_OutputArray<double>(&local_250,(Mat_<double> *)&sqrMeans.field_0x58);
    cv::Size_<int>::Size_(&local_258,_w);
    cv::Point_<int>::Point_(&local_260,-1,-1);
    cv::boxFilter(&local_238,&local_250,6,&local_258,&local_260,1,1);
    cv::_OutputArray::~_OutputArray(&local_250);
    cv::_InputArray::~_InputArray(&local_238);
    cv::_InputArray::_InputArray(&local_278,dst_local);
    cv::_OutputArray::_OutputArray<double>(&local_290,(Mat_<double> *)&variances.field_0x58);
    cv::Size_<int>::Size_(&local_298,_w);
    cv::Point_<int>::Point_((Point_<int> *)&means2.field_0x58,-1,-1);
    cv::sqrBoxFilter(&local_278,&local_290,6,&local_298,&means2.field_0x58,1,1);
    cv::_OutputArray::~_OutputArray(&local_290);
    cv::_InputArray::~_InputArray(&local_278);
    cv::_InputArray::_InputArray<double>(&local_478,(Mat_<double> *)&sqrMeans.field_0x58);
    cv::Mat::mul(local_460,1.0);
    cv::Mat_<double>::Mat_((Mat_<double> *)local_300,(MatExpr *)local_460);
    cv::MatExpr::~MatExpr((MatExpr *)local_460);
    cv::_InputArray::~_InputArray(&local_478);
    cv::_InputArray::_InputArray<double>(&local_750,(Mat_<double> *)&sqrMeans.field_0x58);
    cv::Mat::mul(local_738,1.0);
    cv::operator-(local_5d8,(MatExpr *)&variances.field_0x58);
    cv::Mat_<double>::operator=((Mat_<double> *)&avgVarianceMat.field_0x58,(MatExpr *)local_5d8);
    cv::MatExpr::~MatExpr((MatExpr *)local_5d8);
    cv::MatExpr::~MatExpr((MatExpr *)local_738);
    cv::_InputArray::~_InputArray(&local_750);
    if ((double)block_local < 0.0) {
      cv::_InputArray::_InputArray<double>(&local_768,(Mat_<double> *)&avgVarianceMat.field_0x58);
      cv::_OutputArray::_OutputArray<double>(&local_780,(Mat_<double> *)local_220);
      cv::reduce(&local_768,&local_780,1,0,-1);
      cv::_OutputArray::~_OutputArray(&local_780);
      cv::_InputArray::~_InputArray(&local_768);
      cv::_InputArray::_InputArray<double>(&local_798,(Mat_<double> *)local_220);
      cv::_OutputArray::_OutputArray<double>((_OutputArray *)local_7b0,(Mat_<double> *)local_220);
      cv::reduce(&local_798,(_OutputArray *)local_7b0,0,0,-1);
      cv::_OutputArray::~_OutputArray((_OutputArray *)local_7b0);
      cv::_InputArray::~_InputArray(&local_798);
      pdVar7 = cv::Mat_<double>::operator()((Mat_<double> *)local_220,0,0);
      block_local = (Size *)(*pdVar7 / (double)(local_2c * local_30));
    }
    for (srcRow._4_4_ = 0; pSVar4 = block_local, srcRow._4_4_ < local_2c;
        srcRow._4_4_ = srcRow._4_4_ + 1) {
      dstRow = cv::Mat::ptr<unsigned_char>(dst_local,srcRow._4_4_);
      varRow = (double *)cv::Mat::ptr<unsigned_char>((Mat *)noiseVariance_local,srcRow._4_4_);
      meanRow = cv::Mat::ptr<double>((Mat *)&avgVarianceMat.field_0x58,srcRow._4_4_);
      pdStack_7d8 = cv::Mat::ptr<double>((Mat *)&sqrMeans.field_0x58,srcRow._4_4_);
      for (local_7dc = 0; local_7dc < local_30; local_7dc = local_7dc + 1) {
        dVar1 = pdStack_7d8[local_7dc];
        local_7e8 = 0.0;
        local_7f0 = meanRow[local_7dc] - (double)block_local;
        pdVar7 = std::max<double>(&local_7e8,&local_7f0);
        dVar2 = *pdVar7;
        pdVar7 = std::max<double>(meanRow + local_7dc,(double *)&block_local);
        uVar5 = cv::saturate_cast<unsigned_char>
                          ((dVar2 / *pdVar7) * ((double)dstRow[local_7dc] - pdStack_7d8[local_7dc])
                           + dVar1);
        *(uchar *)((long)varRow + (long)local_7dc) = uVar5;
      }
    }
    cv::Mat_<double>::~Mat_((Mat_<double> *)local_300);
    cv::Mat_<double>::~Mat_((Mat_<double> *)local_220);
    cv::Mat_<double>::~Mat_((Mat_<double> *)&avgVarianceMat.field_0x58);
    cv::Mat_<double>::~Mat_((Mat_<double> *)&variances.field_0x58);
    cv::Mat_<double>::~Mat_((Mat_<double> *)&sqrMeans.field_0x58);
    return (double)pSVar4;
  }
  __assert_fail("(\"src and dst must be one channel grayscale images\", src.channels() == 1, dst.channels() == 1)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/prittt[P]AdaptiveWienerFilter/WienerFilter.cpp"
                ,0x28,"double WienerFilterImpl(const Mat &, Mat &, double, const Size &)");
}

Assistant:

double WienerFilterImpl(const Mat& src, Mat& dst, double noiseVariance, const Size& block) {
	assert(("Invalid block dimensions", block.width % 2 == 1 && block.height % 2 == 1 && block.width > 1 && block.height > 1));
	assert(("src and dst must be one channel grayscale images", src.channels() == 1, dst.channels() == 1));

	int h = src.rows;
	int w = src.cols;

	dst = Mat1b(h, w);

	Mat1d means, sqrMeans, variances;
	Mat1d avgVarianceMat;

	boxFilter(src, means, CV_64F, block, Point(-1, -1), true, BORDER_REPLICATE);
	sqrBoxFilter(src, sqrMeans, CV_64F, block, Point(-1, -1), true, BORDER_REPLICATE);

	Mat1d means2 = means.mul(means);
	variances = sqrMeans - (means.mul(means));

	if (noiseVariance < 0) {
		// I have to estimate the noiseVariance
		reduce(variances, avgVarianceMat, 1, REDUCE_SUM, -1);
		reduce(avgVarianceMat, avgVarianceMat, 0, REDUCE_SUM, -1);
		noiseVariance = avgVarianceMat(0, 0) / (h * w);
	}

	for (int r = 0; r < h; ++r) {
		// get row pointers
		uchar const* const srcRow = src.ptr<uchar>(r);
		uchar* const dstRow = dst.ptr<uchar>(r);
		double* const varRow = variances.ptr<double>(r);
		double* const meanRow = means.ptr<double>(r);
		for (int c = 0; c < w; ++c) {
			dstRow[c] = saturate_cast<uchar>(
				meanRow[c] + max(0., varRow[c] - noiseVariance) / max(varRow[c], noiseVariance) * (srcRow[c] - meanRow[c])
			);
		}
	}

	return noiseVariance;
}